

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

void __thiscall
PString::SetDefaultValue
          (PString *this,void *base,uint offset,
          TArray<std::pair<const_PType_*,_unsigned_int>,_std::pair<const_PType_*,_unsigned_int>_>
          *special)

{
  TArray<std::pair<const_PType_*,_unsigned_int>,_std::pair<const_PType_*,_unsigned_int>_> *this_00;
  pair<const_PString_*,_unsigned_int> pVar1;
  PString *local_50;
  pair<const_PString_*,_unsigned_int> local_48;
  pair<const_PType_*,_unsigned_int> local_38;
  TArray<std::pair<const_PType_*,_unsigned_int>,_std::pair<const_PType_*,_unsigned_int>_> *local_28;
  TArray<std::pair<const_PType_*,_unsigned_int>,_std::pair<const_PType_*,_unsigned_int>_>
  *special_local;
  void *pvStack_18;
  uint offset_local;
  void *base_local;
  PString *this_local;
  
  local_28 = special;
  special_local._4_4_ = offset;
  pvStack_18 = base;
  base_local = this;
  FString::FString((FString *)((long)base + (ulong)offset));
  this_00 = local_28;
  if (local_28 !=
      (TArray<std::pair<const_PType_*,_unsigned_int>,_std::pair<const_PType_*,_unsigned_int>_> *)0x0
     ) {
    local_50 = this;
    pVar1 = std::make_pair<PString_const*,unsigned_int&>
                      (&local_50,(uint *)((long)&special_local + 4));
    local_48.first = pVar1.first;
    local_48.second = pVar1.second;
    std::pair<const_PType_*,_unsigned_int>::pair<const_PString_*,_unsigned_int,_true>
              (&local_38,&local_48);
    TArray<std::pair<const_PType_*,_unsigned_int>,_std::pair<const_PType_*,_unsigned_int>_>::Push
              (this_00,&local_38);
  }
  return;
}

Assistant:

void PString::SetDefaultValue(void *base, unsigned offset, TArray<FTypeAndOffset> *special) const
{
	new((BYTE *)base + offset) FString;
	if (special != NULL)
	{
		special->Push(std::make_pair(this, offset));
	}
}